

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O0

Type * soul::Type::createVector(Type *__return_storage_ptr__,PrimitiveType *element,ArraySize size)

{
  bool bVar1;
  PrimitiveType local_24;
  ArraySize local_20;
  ArraySize size_local;
  PrimitiveType *element_local;
  
  local_20 = size;
  size_local = (ArraySize)element;
  element_local = (PrimitiveType *)__return_storage_ptr__;
  bVar1 = PrimitiveType::canBeVectorElementType(element);
  checkAssertion(bVar1,"element.canBeVectorElementType()","createVector",0xed);
  bVar1 = isLegalVectorSize(local_20);
  checkAssertion(bVar1,"isLegalVectorSize ((int64_t) size)","createVector",0xee);
  PrimitiveType::PrimitiveType(&local_24,element);
  createSizedType(__return_storage_ptr__,&local_24,vector,local_20);
  return __return_storage_ptr__;
}

Assistant:

Type Type::createVector (PrimitiveType element, ArraySize size)
{
    SOUL_ASSERT (element.canBeVectorElementType());
    SOUL_ASSERT (isLegalVectorSize ((int64_t) size));
    return createSizedType (element, Category::vector, size);
}